

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_mn12.c
# Opt level: O0

void mgga_x_mn12_init(xc_func_type *p)

{
  void *pvVar1;
  xc_func_type *in_RDI;
  
  pvVar1 = malloc(0x140);
  in_RDI->params = pvVar1;
  if (in_RDI->info->number == 0xf8) {
    xc_hyb_init_cam(in_RDI,0.0,0.0,0.0);
  }
  else if (in_RDI->info->number == 0x10c) {
    xc_hyb_init_hybrid(in_RDI,0.0);
  }
  else if (in_RDI->info->number == 0x154) {
    xc_hyb_init_hybrid(in_RDI,0.0);
  }
  return;
}

Assistant:

static void
mgga_x_mn12_init(xc_func_type *p)
{
  assert(p->params == NULL);
  p->params = libxc_malloc(sizeof(mgga_x_mn12_params));

  if(p->info->number == XC_HYB_MGGA_X_MN12_SX)
    xc_hyb_init_cam(p, 0.0, 0.0, 0.0);
  else if(p->info->number == XC_HYB_MGGA_X_MN15)
    xc_hyb_init_hybrid(p, 0.0);
  else if(p->info->number == XC_HYB_MGGA_X_CF22D)
    xc_hyb_init_hybrid(p, 0.0);
}